

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::matchNextAux
          (GenMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  Binder *binder_00;
  uint *puVar5;
  Term *nt;
  Binder binder;
  Binder local_30;
  
  binder_00 = (Binder *)CONCAT71(in_register_00000009,separate);
  local_30._parent = this;
  if ((nodeTerm._content & 3) == 0) {
    if (((*(byte *)(nodeTerm._content + 0x28) & 8) == 0) ||
       (uVar4 = Kernel::Term::numVarOccs((Term *)nodeTerm._content), uVar4 != 0)) {
      local_30._maxVar = this->_maxVar;
      if (((queryTerm._content & 3) == 0) &&
         (*(int *)(queryTerm._content + 8) == *(int *)(nodeTerm._content + 8))) {
        cVar2 = Kernel::MatchingUtils::
                matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                          ((MatchingUtils *)nodeTerm._content,(Term *)queryTerm._content,
                           (Term *)&local_30,binder_00);
      }
      else {
        cVar2 = '\0';
      }
    }
    else {
      cVar2 = nodeTerm._content == queryTerm._content;
    }
  }
  else {
    local_30._maxVar = this->_maxVar;
    iVar3 = Binder::bind(&local_30,(int)(nodeTerm._content >> 2),(sockaddr *)queryTerm._content,
                         (socklen_t)binder_00);
    cVar2 = (char)iVar3;
  }
  if (separate && cVar2 == '\0') {
    puVar5 = (this->_boundVars)._cursor;
    uVar4 = puVar5[-1];
    puVar5 = puVar5 + -1;
    if (uVar4 != 0xffffffff) {
      pAVar1 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
      do {
        pAVar1[uVar4]._timestamp = 0;
        uVar4 = puVar5[-1];
        puVar5 = puVar5 + -1;
      } while (uVar4 != 0xffffffff);
    }
    (this->_boundVars)._cursor = puVar5;
  }
  return (bool)cVar2;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  bool success;
  if(nodeTerm.isTerm()) {
    Term* nt=nodeTerm.term();
    if(nt->shared() && nt->ground()) {
      //ground terms match only iff they're equal
      success = nodeTerm==queryTerm;
    } else {
      Binder binder(this);
      ASS(nt->arity()>0);

      success = queryTerm.isTerm() && queryTerm.term()->functor()==nt->functor() &&
	MatchingUtils::matchArgs(nt, queryTerm.term(), binder);
    }
  } else {
    ASS_METHOD(nodeTerm,isOrdinaryVar());
    unsigned var=nodeTerm.var();
    Binder binder(this);
    success=binder.bind(var,queryTerm);
  }

  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind ordinary variables, that were bound.
      for(;;) {
	unsigned boundVar = _boundVars.pop();
	if(boundVar==BACKTRACK_SEPARATOR) {
	  break;
	}
	_bindings.remove(boundVar);
      }
    }
  }

  return success;
}